

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_enc_build_inter_predictor_y_nonrd
               (MACROBLOCKD *xd,InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int block_width;
  int block_height;
  long lVar4;
  InterpFilters *filter;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int dst_stride;
  int src_stride;
  uint8_t *dst;
  uint8_t *src;
  buf_2d *pre_buf;
  buf_2d *dst_buf;
  MB_MODE_INFO *mbmi;
  macroblockd_plane *pd;
  int in_stack_ffffffffffffffac;
  
  lVar4 = *(long *)(in_RDI + 0x48);
  iVar1 = *(int *)(in_RDX + 0x14);
  iVar2 = *(int *)(in_RDI + 0x58);
  iVar3 = *(int *)(in_RDX + 0x10);
  filter = *(InterpFilters **)(in_RDI + 0x20);
  block_width = *(int *)(in_RDI + 0x58);
  block_height = *(int *)(in_RDI + 0x38);
  *(undefined8 *)(in_RSI + 0x80) = *(undefined8 *)(in_RDI + 0x40);
  *(undefined8 *)(in_RSI + 0x88) = *(undefined8 *)(in_RDI + 0x48);
  *(undefined8 *)(in_RSI + 0x90) = *(undefined8 *)(in_RDI + 0x50);
  *(undefined8 *)(in_RSI + 0x98) = *(undefined8 *)(in_RDI + 0x58);
  init_interp_filter_params
            ((InterpFilterParams **)(lVar4 + (iVar1 >> 10) * iVar2 + (long)(iVar3 >> 10)),filter,
             block_width,block_height,in_stack_ffffffffffffffac);
  av1_make_inter_predictor
            (&mbmi->bsize,dst_buf._4_4_,(uint8_t *)pre_buf,src._4_4_,(InterPredParams *)dst,
             _dst_stride);
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y_nonrd(MACROBLOCKD *xd,
                                           InterPredParams *inter_pred_params,
                                           const SubpelParams *subpel_params) {
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d *const dst_buf = &pd->dst;
  const struct buf_2d *pre_buf = &pd->pre[0];
  const uint8_t *src =
      pre_buf->buf0 +
      (subpel_params->pos_y >> SCALE_SUBPEL_BITS) * pre_buf->stride +
      (subpel_params->pos_x >> SCALE_SUBPEL_BITS);
  uint8_t *const dst = dst_buf->buf;
  int src_stride = pre_buf->stride;
  int dst_stride = dst_buf->stride;
  inter_pred_params->ref_frame_buf = *pre_buf;

  // Initialize interp filter for single reference mode.
  init_interp_filter_params(inter_pred_params->interp_filter_params,
                            &mbmi->interp_filters.as_filters, pd->width,
                            pd->height, /*is_intrabc=*/0);

  av1_make_inter_predictor(src, src_stride, dst, dst_stride, inter_pred_params,
                           subpel_params);
}